

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void SerializeHDKeypath<DataStream>(DataStream *s,KeyOriginInfo hd_keypath)

{
  long lVar1;
  KeyOriginInfo hd_keypath_00;
  undefined4 *in_RSI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  pointer local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>(s,(*(long *)(in_RSI + 4) - *(long *)(in_RSI + 2)) + 4);
  uVar2 = *in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffc8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 2));
  hd_keypath_00.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar2;
  hd_keypath_00.fingerprint[0] = (char)in_stack_ffffffffffffffb8;
  hd_keypath_00.fingerprint[1] = (char)((ulong)in_stack_ffffffffffffffb8 >> 8);
  hd_keypath_00.fingerprint[2] = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x10);
  hd_keypath_00.fingerprint[3] = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x18);
  hd_keypath_00._4_4_ = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  hd_keypath_00.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffffc4;
  hd_keypath_00.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = in_stack_ffffffffffffffc8;
  hd_keypath_00.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffd0;
  SerializeKeyOrigin<DataStream>(s,hd_keypath_00);
  if (in_stack_ffffffffffffffc8 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffc8,(long)local_28 - (long)in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeHDKeypath(Stream& s, KeyOriginInfo hd_keypath)
{
    WriteCompactSize(s, (hd_keypath.path.size() + 1) * sizeof(uint32_t));
    SerializeKeyOrigin(s, hd_keypath);
}